

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QMessagePattern::BacktraceParams>::clear(QList<QMessagePattern::BacktraceParams> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QGenericArrayOps<QMessagePattern::BacktraceParams> *this_00;
  __off_t __length;
  QArrayDataPointer<QMessagePattern::BacktraceParams> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QMessagePattern::BacktraceParams> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QMessagePattern::BacktraceParams> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QMessagePattern::BacktraceParams> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QMessagePattern::BacktraceParams>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QMessagePattern::BacktraceParams>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QMessagePattern::BacktraceParams> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QMessagePattern::BacktraceParams>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QMessagePattern::BacktraceParams>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QMessagePattern::BacktraceParams>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QMessagePattern::BacktraceParams>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QGenericArrayOps<QMessagePattern::BacktraceParams> *)
                QArrayDataPointer<QMessagePattern::BacktraceParams>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QMessagePattern::BacktraceParams>::truncate
                (this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }